

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  int i;
  ImGuiWindow *this;
  ImGuiTable *table_00;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 IVar5;
  ImGuiTableColumn *column_00;
  char *text_end;
  float _y;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  ImRect IVar9;
  ImGuiTableColumn *local_120;
  ImGuiTableColumn *local_118;
  ImGuiCol local_10c;
  bool local_f9;
  bool text_clipped;
  ImGuiSortDirection local_d8;
  ImVec2 IStack_d4;
  ImGuiSortDirection sort_direction;
  ImVec2 local_cc;
  float local_c4;
  float local_c0;
  float y;
  float x;
  float ellipsis_max;
  ImGuiTableColumn *next_column;
  ImGuiTableColumn *prev_column;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  undefined1 local_98 [8];
  ImRect bb;
  ImGuiID id;
  float fStack_7c;
  bool selected;
  float max_pos_x;
  char local_70 [4];
  float ARROW_SCALE;
  char sort_order_suf [4];
  float w_sort_text;
  float w_arrow;
  float label_height;
  ImRect cell_r;
  ImVec2 label_pos;
  ImVec2 label_size;
  char *label_end;
  ImGuiTableColumn *column;
  int column_n;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *label_local;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    table_00 = GImGui->CurrentTable;
    if (table_00 == (ImGuiTable *)0x0) {
      __assert_fail("table != __null && \"Need to call TableHeader() after BeginTable()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_tables.cpp"
                    ,0xb1d,"void ImGui::TableHeader(const char *)");
    }
    if (table_00->CurrentColumn == -1) {
      __assert_fail("table->CurrentColumn != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_tables.cpp"
                    ,0xb1e,"void ImGui::TableHeader(const char *)");
    }
    i = table_00->CurrentColumn;
    column_00 = ImSpan<ImGuiTableColumn>::operator[](&table_00->Columns,i);
    g = (ImGuiContext *)label;
    if (label == (char *)0x0) {
      g = (ImGuiContext *)0x4910c7;
    }
    text_end = FindRenderedTextEnd(&g->Initialized,(char *)0x0);
    label_pos = CalcTextSize(&g->Initialized,text_end,true,-1.0);
    cell_r.Max = (this->DC).CursorPos;
    IVar9 = TableGetCellBgRect(table_00,i);
    _y = ImMax<float>(label_pos.y,
                      -table_00->CellPaddingY + -table_00->CellPaddingY + table_00->RowMinHeight);
    sort_order_suf[0] = '\0';
    sort_order_suf[1] = '\0';
    sort_order_suf[2] = '\0';
    sort_order_suf[3] = '\0';
    ARROW_SCALE = 0.0;
    memset(local_70,0,4);
    if ((((table_00->Flags & 8U) != 0) && ((column_00->Flags & 0x100U) == 0)) &&
       (sort_order_suf =
             (char  [4])ImFloor(pIVar3->FontSize * 0.65 + (pIVar3->Style).FramePadding.x),
       '\0' < column_00->SortOrder)) {
      ImFormatString(local_70,4,"%d",(ulong)((int)column_00->SortOrder + 1));
      fVar6 = (pIVar3->Style).ItemInnerSpacing.x;
      IVar8 = CalcTextSize(local_70,(char *)0x0,false,-1.0);
      fStack_7c = IVar8.x;
      ARROW_SCALE = fVar6 + fStack_7c;
    }
    fVar6 = cell_r.Max.x + label_pos.x + ARROW_SCALE + (float)sort_order_suf;
    fVar7 = ImMax<float>(column_00->ContentMaxXHeadersUsed,column_00->WorkMaxX);
    column_00->ContentMaxXHeadersUsed = fVar7;
    fVar6 = ImMax<float>(column_00->ContentMaxXHeadersIdeal,fVar6);
    column_00->ContentMaxXHeadersIdeal = fVar6;
    local_f9 = false;
    if (((table_00->IsContextPopupOpen & 1U) != 0) &&
       (local_f9 = false, table_00->ContextPopupColumn == i)) {
      local_f9 = table_00->InstanceInteracted == table_00->InstanceCurrent;
    }
    bb.Max.y._3_1_ = local_f9;
    bb.Max.x = (float)ImGuiWindow::GetID(this,&g->Initialized,(char *)0x0);
    w_arrow = IVar9.Min.x;
    label_height = IVar9.Min.y;
    cell_r.Min.x = IVar9.Max.x;
    cell_r.Min.y = IVar9.Max.y;
    fVar6 = (pIVar3->Style).CellPadding.y;
    fVar6 = ImMax<float>(cell_r.Min.y,fVar6 + fVar6 + label_height + _y);
    ImRect::ImRect((ImRect *)local_98,w_arrow,label_height,cell_r.Min.x,fVar6);
    ImVec2::ImVec2((ImVec2 *)&col,0.0,_y);
    ItemSize((ImVec2 *)&col,-1.0);
    bVar4 = ItemAdd((ImRect *)local_98,(ImGuiID)bb.Max.x,(ImRect *)0x0,0);
    if (bVar4) {
      prev_column._5_1_ =
           ButtonBehavior((ImRect *)local_98,(ImGuiID)bb.Max.x,(bool *)((long)&prev_column + 7),
                          (bool *)((long)&prev_column + 6),0x1000);
      if ((float)pIVar3->ActiveId != bb.Max.x) {
        SetItemAllowOverlap();
      }
      if ((((prev_column._6_1_ & 1) == 0) && ((prev_column._7_1_ & 1) == 0)) &&
         ((bb.Max.y._3_1_ & 1) == 0)) {
        if ((*(uint *)&table_00->field_0x98 & 1) == 0) {
          IVar5 = GetColorU32(0x2a,1.0);
          TableSetBgColor(3,IVar5,table_00->CurrentColumn);
        }
      }
      else {
        if ((prev_column._6_1_ & 1) == 0) {
          local_10c = 0x18;
          if ((prev_column._7_1_ & 1) != 0) {
            local_10c = 0x19;
          }
        }
        else {
          local_10c = 0x1a;
        }
        prev_column._0_4_ = GetColorU32(local_10c,1.0);
        TableSetBgColor(3,(ImU32)prev_column,table_00->CurrentColumn);
        RenderNavHighlight((ImRect *)local_98,(ImGuiID)bb.Max.x,10);
      }
      if ((prev_column._6_1_ & 1) != 0) {
        table_00->HeldHeaderColumn = (ImGuiTableColumnIdx)i;
      }
      (this->DC).CursorPos.y = -(pIVar3->Style).ItemSpacing.y * 0.5 + (this->DC).CursorPos.y;
      if (((((prev_column._6_1_ & 1) != 0) && ((table_00->Flags & 2U) != 0)) &&
          (bVar4 = IsMouseDragging(0,-1.0), bVar4)) && ((pIVar3->DragDropActive & 1U) == 0)) {
        table_00->ReorderColumn = (ImGuiTableColumnIdx)i;
        table_00->InstanceInteracted = table_00->InstanceCurrent;
        pIVar1 = &(pIVar3->IO).MouseDelta;
        if ((pIVar1->x <= 0.0 && pIVar1->x != 0.0) && ((pIVar3->IO).MousePos.x < w_arrow)) {
          if (column_00->PrevEnabledColumn == -1) {
            local_118 = (ImGuiTableColumn *)0x0;
          }
          else {
            local_118 = ImSpan<ImGuiTableColumn>::operator[]
                                  (&table_00->Columns,(int)column_00->PrevEnabledColumn);
          }
          next_column = local_118;
          if (((local_118 != (ImGuiTableColumn *)0x0) &&
              (((column_00->Flags | local_118->Flags) & 0x20U) == 0)) &&
             (column_00->IndexWithinEnabledSet < table_00->FreezeColumnsRequest ==
              local_118->IndexWithinEnabledSet < table_00->FreezeColumnsRequest)) {
            table_00->ReorderColumnDir = -1;
          }
        }
        if ((0.0 < (pIVar3->IO).MouseDelta.x) && (cell_r.Min.x < (pIVar3->IO).MousePos.x)) {
          if (column_00->NextEnabledColumn == -1) {
            local_120 = (ImGuiTableColumn *)0x0;
          }
          else {
            local_120 = ImSpan<ImGuiTableColumn>::operator[]
                                  (&table_00->Columns,(int)column_00->NextEnabledColumn);
          }
          _x = local_120;
          if (((local_120 != (ImGuiTableColumn *)0x0) &&
              (((column_00->Flags | local_120->Flags) & 0x20U) == 0)) &&
             (column_00->IndexWithinEnabledSet < table_00->FreezeColumnsRequest ==
              local_120->IndexWithinEnabledSet < table_00->FreezeColumnsRequest)) {
            table_00->ReorderColumnDir = '\x01';
          }
        }
      }
      y = (cell_r.Min.x - (float)sort_order_suf) - ARROW_SCALE;
      if (((table_00->Flags & 8U) != 0) && ((column_00->Flags & 0x100U) == 0)) {
        if (column_00->SortOrder != -1) {
          local_c0 = ImMax<float>(w_arrow,(cell_r.Min.x - (float)sort_order_suf) - ARROW_SCALE);
          local_c4 = cell_r.Max.y;
          if ('\0' < column_00->SortOrder) {
            IVar5 = GetColorU32(0,0.7);
            PushStyleColor(0,IVar5);
            ImVec2::ImVec2(&local_cc,local_c0 + (pIVar3->Style).ItemInnerSpacing.x,local_c4);
            RenderText(local_cc,local_70,(char *)0x0,true);
            PopStyleColor(1);
            local_c0 = ARROW_SCALE + local_c0;
          }
          pIVar2 = this->DrawList;
          ImVec2::ImVec2(&stack0xffffffffffffff2c,local_c0,local_c4);
          IVar5 = GetColorU32(0,1.0);
          RenderArrow(pIVar2,IStack_d4,IVar5,(column_00->field_0x64 & 3) == 1 ^ 3,0.65);
        }
        if (((prev_column._5_1_ & 1) != 0) && (table_00->ReorderColumn != i)) {
          local_d8 = TableGetColumnNextSortDirection(column_00);
          TableSetColumnSortDirection(i,local_d8,(bool)((pIVar3->IO).KeyShift & 1));
        }
      }
      pIVar2 = this->DrawList;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff20,y,
                     cell_r.Max.y + _y + (pIVar3->Style).FramePadding.y);
      RenderTextEllipsis(pIVar2,&cell_r.Max,(ImVec2 *)&stack0xffffffffffffff20,y,y,&g->Initialized,
                         text_end,&label_pos);
      if (((y - cell_r.Max.x < label_pos.x) && ((prev_column._7_1_ & 1) != 0)) &&
         (pIVar3->TooltipSlowDelay <= pIVar3->HoveredIdNotActiveTimer &&
          pIVar3->HoveredIdNotActiveTimer != pIVar3->TooltipSlowDelay)) {
        SetTooltip("%.*s",(ulong)(uint)((int)text_end - (int)g),g);
      }
      bVar4 = IsMouseReleased(1);
      if ((bVar4) && (bVar4 = IsItemHovered(0), bVar4)) {
        TableOpenContextMenu(i);
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}